

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

void Js::JavascriptExceptionOperators::DispatchExceptionToDebugger
               (JavascriptExceptionObject *exceptionObject,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebugContext *pDVar4;
  ProbeContainer *pPVar5;
  undefined1 local_58 [8];
  InterpreterHaltState haltState;
  ScriptContext *scriptContext_local;
  JavascriptExceptionObject *exceptionObject_local;
  
  haltState.activeMutationBP = (MutationBreakpoint *)scriptContext;
  if (exceptionObject == (JavascriptExceptionObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x55a,"(exceptionObject != __null)","exceptionObject != NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (haltState.activeMutationBP == (MutationBreakpoint *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x55b,"(scriptContext != __null)","scriptContext != NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ScriptContext::IsScriptContextInDebugMode((ScriptContext *)haltState.activeMutationBP);
  if (bVar2) {
    pDVar4 = ScriptContext::GetDebugContext((ScriptContext *)haltState.activeMutationBP);
    pPVar5 = DebugContext::GetProbeContainer(pDVar4);
    bVar2 = Js::ProbeContainer::HasAllowedForException(pPVar5,exceptionObject);
    if (bVar2) {
      InterpreterHaltState::InterpreterHaltState
                ((InterpreterHaltState *)local_58,STOP_EXCEPTIONTHROW,(FunctionBody *)0x0,
                 (MutationBreakpoint *)0x0);
      haltState.referencedDiagnosticArena = (ReferencedArenaAdapter *)exceptionObject;
      pDVar4 = ScriptContext::GetDebugContext((ScriptContext *)haltState.activeMutationBP);
      pPVar5 = DebugContext::GetProbeContainer(pDVar4);
      Js::ProbeContainer::DispatchExceptionBreakpoint(pPVar5,(InterpreterHaltState *)local_58);
    }
  }
  return;
}

Assistant:

void JavascriptExceptionOperators::DispatchExceptionToDebugger(Js::JavascriptExceptionObject * exceptionObject, ScriptContext* scriptContext)
    {
        Assert(exceptionObject != NULL);
        Assert(scriptContext != NULL);

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (scriptContext->IsScriptContextInDebugMode()
            && scriptContext->GetDebugContext()->GetProbeContainer()->HasAllowedForException(exceptionObject))
        {
            InterpreterHaltState haltState(STOP_EXCEPTIONTHROW, /*executingFunction*/nullptr);

            haltState.exceptionObject = exceptionObject;

            scriptContext->GetDebugContext()->GetProbeContainer()->DispatchExceptionBreakpoint(&haltState);
        }
#endif
    }